

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O0

pair<bool,_bool> __thiscall cab::route_contains_ordered(cab *this,node_type src,node_type dst)

{
  bool bVar1;
  reference pnVar2;
  byte local_3b;
  byte local_3a;
  iterator iStack_38;
  node_type n;
  iterator __end1;
  iterator __begin1;
  vector<node_type,_std::allocator<node_type>_> *__range1;
  bool found_dst;
  bool found_src;
  node_type dst_local;
  cab *pcStack_18;
  node_type src_local;
  cab *this_local;
  
  __range1._5_1_ = 0;
  __range1._4_1_ = 0;
  __range1._6_1_ = dst;
  __range1._7_1_ = src;
  pcStack_18 = this;
  __end1 = std::vector<node_type,_std::allocator<node_type>_>::begin(&this->_route);
  iStack_38 = std::vector<node_type,_std::allocator<node_type>_>::end(&this->_route);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar1) {
    pnVar2 = __gnu_cxx::
             __normal_iterator<node_type_*,_std::vector<node_type,_std::allocator<node_type>_>_>::
             operator*(&__end1);
    local_3a = 1;
    if (__range1._7_1_ != *pnVar2) {
      local_3a = __range1._5_1_;
    }
    __range1._5_1_ = local_3a & 1;
    if ((__range1._6_1_ != *pnVar2) || (local_3b = 1, __range1._5_1_ == 0)) {
      local_3b = __range1._4_1_;
    }
    __range1._4_1_ = local_3b & 1;
    if ((__range1._5_1_ != 0) && (__range1._4_1_ != 0)) break;
    __gnu_cxx::__normal_iterator<node_type_*,_std::vector<node_type,_std::allocator<node_type>_>_>::
    operator++(&__end1);
  }
  std::pair<bool,_bool>::pair<bool_&,_bool_&,_true>
            ((pair<bool,_bool> *)((long)&this_local + 6),(bool *)((long)&__range1 + 5),
             (bool *)((long)&__range1 + 4));
  return this_local._6_2_;
}

Assistant:

std::pair<bool, bool> cab::route_contains_ordered(node_type src, node_type dst)
{
    bool found_src = false, found_dst = false;
    for(auto n : _route)
    {
        found_src = src == n || found_src;
        found_dst = dst == n && found_src || found_dst;

        if(found_src && found_dst)
        {
            break;
        }
    }

    return std::pair<bool, bool> (found_src, found_dst);
}